

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_test.cpp
# Opt level: O0

void __thiscall HuffmanTest::test_read_char(HuffmanTest *this,char ch)

{
  char cVar1;
  char in_SIL;
  char res;
  BitReader out;
  stringstream os;
  undefined7 in_stack_fffffffffffffe38;
  BitReader *this_00;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined1 in_stack_fffffffffffffe57;
  BitReader local_1a8;
  BitReader local_198;
  ostream local_188 [383];
  char local_9;
  
  this_00 = &local_198;
  local_9 = in_SIL;
  std::__cxx11::stringstream::stringstream((stringstream *)this_00);
  BitReader::BitReader(&local_1a8,(istream *)this_00);
  std::operator<<(local_188,local_9);
  cVar1 = BitReader::read_char(this_00);
  Test::check((bool)in_stack_fffffffffffffe57,
              (char *)CONCAT44(in_stack_fffffffffffffe4c,
                               CONCAT13(cVar1,(int3)in_stack_fffffffffffffe48)),(char *)this_00,
              CONCAT17(cVar1,in_stack_fffffffffffffe38));
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_198);
  return;
}

Assistant:

void HuffmanTest::test_read_char(char ch) {
    std::stringstream os;
    BitReader out(os);
    os << ch;
    char res = out.read_char();
    DO_CHECK(res == ch);
}